

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psroipooling.cpp
# Opt level: O0

int __thiscall
ncnn::PSROIPooling::forward
          (PSROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  int *piVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Mat *in_RDI;
  double dVar4;
  int index;
  int x;
  int y;
  float sum;
  int area;
  bool is_empty;
  int wend;
  int hend;
  int wstart;
  int hstart;
  float *ptr;
  int pw;
  int ph;
  float *outptr;
  int q;
  float bin_size_h;
  float bin_size_w;
  float roi_h;
  float roi_w;
  float roi_y2;
  float roi_x2;
  float roi_y1;
  float roi_x1;
  float *roi_ptr;
  Mat *top_blob;
  Mat *roi_blob;
  int channels;
  size_t elemsize;
  int h;
  int w;
  Mat *bottom_blob;
  float local_1a8;
  Mat *in_stack_fffffffffffffe60;
  Mat *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  int _c;
  Mat *this_00;
  undefined8 in_stack_fffffffffffffe78;
  int local_174;
  int local_170;
  float local_16c;
  int local_160 [5];
  int local_14c;
  int local_148;
  int local_144;
  Mat local_140;
  Mat *local_100;
  int local_f4;
  int local_f0;
  Mat local_e0;
  float *local_a0;
  int local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float *local_60;
  reference local_58;
  const_reference local_50;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  _c = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->w;
  local_38 = local_30->h;
  local_40 = local_30->elemsize;
  local_44 = local_30->c;
  local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  if (local_44 ==
      *(int *)((long)&in_RDI[2].refcount + 4) * *(int *)&in_RDI[2].data *
      *(int *)((long)&in_RDI[2].data + 4)) {
    local_58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_RDI,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                (int)in_stack_fffffffffffffe78,_c,(size_t)in_stack_fffffffffffffe68,
                (Allocator *)in_stack_fffffffffffffe60);
    bVar1 = Mat::empty(in_stack_fffffffffffffe60);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_60 = Mat::operator_cast_to_float_(local_50);
      dVar4 = std::round((double)(ulong)(uint)*local_60);
      local_64 = SUB84(dVar4,0) * *(float *)&in_RDI[2].refcount;
      dVar4 = std::round((double)(ulong)(uint)local_60[1]);
      local_68 = SUB84(dVar4,0) * *(float *)&in_RDI[2].refcount;
      dVar4 = std::round((double)(ulong)(uint)(local_60[2] + 1.0));
      local_6c = SUB84(dVar4,0) * *(float *)&in_RDI[2].refcount;
      dVar4 = std::round((double)(ulong)(uint)(local_60[3] + 1.0));
      local_70 = SUB84(dVar4,0) * *(float *)&in_RDI[2].refcount;
      local_78 = local_6c - local_64;
      local_7c = 0.1;
      pfVar2 = std::max<float>(&local_78,&local_7c);
      local_74 = *pfVar2;
      local_84 = local_70 - local_68;
      local_88 = 0.1;
      pfVar2 = std::max<float>(&local_84,&local_88);
      local_80 = *pfVar2;
      local_8c = local_74 / (float)*(int *)&in_RDI[2].data;
      local_90 = local_80 / (float)*(int *)((long)&in_RDI[2].data + 4);
      for (local_94 = 0; local_94 < *(int *)((long)&in_RDI[2].refcount + 4); local_94 = local_94 + 1
          ) {
        this_00 = &local_e0;
        Mat::channel(in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x1a5f42);
        local_a0 = pfVar2;
        for (local_f0 = 0; local_f0 < *(int *)((long)&in_RDI[2].data + 4); local_f0 = local_f0 + 1)
        {
          for (local_f4 = 0; local_f4 < *(int *)&in_RDI[2].data; local_f4 = local_f4 + 1) {
            in_stack_fffffffffffffe60 = &local_140;
            Mat::channel(in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
            in_stack_fffffffffffffe68 =
                 (Mat *)Mat::operator_cast_to_float_(in_stack_fffffffffffffe60);
            Mat::~Mat((Mat *)0x1a5ff7);
            local_100 = in_stack_fffffffffffffe68;
            dVar4 = std::floor((double)(ulong)(uint)(local_68 + (float)local_f0 * local_90));
            local_144 = (int)SUB84(dVar4,0);
            dVar4 = std::floor((double)(ulong)(uint)(local_64 + (float)local_f4 * local_8c));
            local_148 = (int)SUB84(dVar4,0);
            dVar4 = std::ceil((double)(ulong)(uint)(local_68 + (float)(local_f0 + 1) * local_90));
            local_14c = (int)SUB84(dVar4,0);
            dVar4 = std::ceil((double)(ulong)(uint)(local_64 + (float)(local_f4 + 1) * local_8c));
            local_160[4] = (int)SUB84(dVar4,0);
            local_160[3] = 0;
            piVar3 = std::max<int>(&local_144,local_160 + 3);
            piVar3 = std::min<int>(piVar3,&local_38);
            local_144 = *piVar3;
            local_160[2] = 0;
            piVar3 = std::max<int>(&local_148,local_160 + 2);
            piVar3 = std::min<int>(piVar3,&local_34);
            local_148 = *piVar3;
            local_160[1] = 0;
            piVar3 = std::max<int>(&local_14c,local_160 + 1);
            piVar3 = std::min<int>(piVar3,&local_38);
            local_14c = *piVar3;
            local_160[0] = 0;
            piVar3 = std::max<int>(local_160 + 4,local_160);
            piVar3 = std::min<int>(piVar3,&local_34);
            local_160[4] = *piVar3;
            local_16c = 0.0;
            for (local_170 = local_144; local_170 < local_14c; local_170 = local_170 + 1) {
              for (local_174 = local_148; local_174 < local_160[4]; local_174 = local_174 + 1) {
                local_16c = *(float *)((long)&local_100->data +
                                      (long)(local_170 * local_34 + local_174) * 4) + local_16c;
              }
            }
            if (local_144 < local_14c && local_148 < local_160[4]) {
              local_1a8 = local_16c / (float)((local_14c - local_144) * (local_160[4] - local_148));
            }
            else {
              local_1a8 = 0.0;
            }
            local_a0[local_f4] = local_1a8;
          }
          local_a0 = local_a0 + *(int *)&in_RDI[2].data;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int PSROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    if (channels != output_dim * pooled_width * pooled_height)
    {
        // input channel number does not match layer parameters
        return -1;
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, output_dim, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = round(roi_ptr[0]) * spatial_scale;
    float roi_y1 = round(roi_ptr[1]) * spatial_scale;
    float roi_x2 = round(roi_ptr[2] + 1.f) * spatial_scale;
    float roi_y2 = round(roi_ptr[3] + 1.f) * spatial_scale;

    float roi_w = std::max(roi_x2 - roi_x1, 0.1f);
    float roi_h = std::max(roi_y2 - roi_y1, 0.1f);

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<output_dim; q++)
    {
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                const float* ptr = bottom_blob.channel((q * pooled_height + ph) * pooled_width + pw);

                int hstart = floor(roi_y1 + (float)(ph) * bin_size_h);
                int wstart = floor(roi_x1 + (float)(pw) * bin_size_w);
                int hend = ceil(roi_y1 + (float)(ph + 1) * bin_size_h);
                int wend = ceil(roi_x1 + (float)(pw + 1) * bin_size_w);

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);
                int area = (hend - hstart) * (wend - wstart);

                float sum = 0.f;
                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        sum += ptr[index];
                    }
                }

                outptr[pw] = is_empty ? 0.f : (sum / (float)area);
            }

            outptr += pooled_width;
        }
    }

    return 0;
}